

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O0

void duckdb::SerializeVersionNumber(WriteStream *ser,string *version_str)

{
  void *__src;
  unsigned_long uVar1;
  undefined8 *in_RDI;
  data_t version [32];
  undefined1 local_38 [48];
  undefined8 *local_8;
  
  local_8 = in_RDI;
  memset(local_38,0,0x20);
  __src = (void *)::std::__cxx11::string::c_str();
  uVar1 = ::std::__cxx11::string::size();
  uVar1 = MinValue<unsigned_long>(uVar1,0x20);
  memcpy(local_38,__src,uVar1);
  (**(code **)*local_8)(local_8,local_38,0x20);
  return;
}

Assistant:

void SerializeVersionNumber(WriteStream &ser, const string &version_str) {
	data_t version[MainHeader::MAX_VERSION_SIZE];
	memset(version, 0, MainHeader::MAX_VERSION_SIZE);
	memcpy(version, version_str.c_str(), MinValue<idx_t>(version_str.size(), MainHeader::MAX_VERSION_SIZE));
	ser.WriteData(version, MainHeader::MAX_VERSION_SIZE);
}